

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::PopulateFormalsScope
          (ByteCodeGenerator *this,uint beginOffset,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  anon_class_40_5_07c1c418 handler;
  anon_class_40_5_07c1c418 handler_00;
  FuncInfo *pFVar1;
  ParseNodePtr pnodeArg;
  ParseNodeParamPattern *pPVar2;
  ParseNode *pPVar3;
  FunctionBody *pFVar4;
  anon_class_40_5_07c1c418 local_78;
  DebuggerScope *local_50;
  DebuggerScope *debuggerScope;
  FuncInfo *pFStack_40;
  uint beginOffset_local;
  FuncInfo *funcInfo_local;
  ParseNodeFnc *pnodeFnc_local;
  
  local_78.beginOffset = (uint *)((long)&debuggerScope + 4);
  local_78.funcInfo = &stack0xffffffffffffffc0;
  local_78.pnodeFnc = (ParseNodeFnc **)&funcInfo_local;
  local_50 = (DebuggerScope *)0x0;
  local_78.debuggerScope = &local_50;
  local_78.this = this;
  debuggerScope._4_4_ = beginOffset;
  pFStack_40 = funcInfo;
  funcInfo_local = (FuncInfo *)pnodeFnc;
  for (pnodeArg = pnodeFnc->pnodeParams; pnodeArg != (ParseNode *)0x0;
      pnodeArg = ParseNode::GetFormalNext(pnodeArg)) {
    PopulateFormalsScope::anon_class_40_5_07c1c418::operator()(&local_78,pnodeArg);
  }
  if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
    PopulateFormalsScope::anon_class_40_5_07c1c418::operator()(&local_78,pnodeFnc->pnodeRest);
  }
  pFVar1 = funcInfo_local;
  local_78.pnodeFnc = (ParseNodeFnc **)&funcInfo_local;
  local_78.funcInfo = &stack0xffffffffffffffc0;
  local_78.beginOffset = (uint *)((long)&debuggerScope + 4);
  local_78.debuggerScope = &local_50;
  local_78.this = this;
  for (pPVar3 = *(ParseNode **)&funcInfo_local->varRegsCount; pPVar3 != (ParseNode *)0x0;
      pPVar3 = ParseNode::GetFormalNext(pPVar3)) {
    if (pPVar3->nop == knopParamPattern) {
      pPVar2 = ParseNode::AsParseNodeParamPattern(pPVar3);
      handler.this = local_78.this;
      handler.debuggerScope = local_78.debuggerScope;
      handler.pnodeFnc = local_78.pnodeFnc;
      handler.funcInfo = local_78.funcInfo;
      handler.beginOffset = local_78.beginOffset;
      Parser::
      MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
                ((pPVar2->super_ParseNodeUni).pnode1,handler);
    }
  }
  pPVar3 = *(ParseNode **)&pFVar1->currentInnerScopeIndex;
  if ((pPVar3 != (ParseNode *)0x0) && (pPVar3->nop == knopParamPattern)) {
    pPVar2 = ParseNode::AsParseNodeParamPattern(pPVar3);
    handler_00.this = local_78.this;
    handler_00.debuggerScope = local_78.debuggerScope;
    handler_00.pnodeFnc = local_78.pnodeFnc;
    handler_00.funcInfo = local_78.funcInfo;
    handler_00.beginOffset = local_78.beginOffset;
    Parser::
    MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
              ((pPVar2->super_ParseNodeUni).pnode1,handler_00);
  }
  if (local_50 != (DebuggerScope *)0x0) {
    pFVar4 = FuncInfo::GetParsedFunctionBody(pFStack_40);
    if ((pFVar4->field_0x17b & 4) == 0) {
      InsertPropertyToDebuggerScope(this,pFStack_40,local_50,pFStack_40->argumentsSymbol);
    }
    RecordEndScopeObject(this,(ParseNode *)funcInfo_local);
  }
  return;
}

Assistant:

void ByteCodeGenerator::PopulateFormalsScope(uint beginOffset, FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc)
{
    Js::DebuggerScope *debuggerScope = nullptr;
    auto processArg = [&](ParseNode *pnodeArg) {
        if (pnodeArg->IsVarLetOrConst())
        {
            if (debuggerScope == nullptr)
            {
                debuggerScope = RecordStartScopeObject(pnodeFnc, funcInfo->paramScope && funcInfo->paramScope->GetIsObject() ? Js::DiagParamScopeInObject : Js::DiagParamScope);
                debuggerScope->SetBegin(beginOffset);
            }

            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, pnodeArg->AsParseNodeVar()->sym);
        }
    };

    MapFormals(pnodeFnc, processArg);
    MapFormalsFromPattern(pnodeFnc, processArg);

    if (debuggerScope != nullptr)
    {
        if (!funcInfo->GetParsedFunctionBody()->IsParamAndBodyScopeMerged())
        {
            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, funcInfo->GetArgumentsSymbol());
        }

        RecordEndScopeObject(pnodeFnc);
    }
}